

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O2

void __thiscall spdlog::details::scoped_padder::~scoped_padder(scoped_padder *this)

{
  long count;
  
  count = this->remaining_pad_;
  if (count < 0) {
    if (this->padinfo_->truncate_ == true) {
      ::fmt::v8::detail::buffer<char>::try_resize
                (&this->dest_->super_buffer<char>,count + (this->dest_->super_buffer<char>).size_);
    }
  }
  else {
    pad_it(this,count);
  }
  return;
}

Assistant:

~scoped_padder()
    {
        if (remaining_pad_ >= 0)
        {
            pad_it(remaining_pad_);
        }
        else if (padinfo_.truncate_)
        {
            long new_size = static_cast<long>(dest_.size()) + remaining_pad_;
            dest_.resize(static_cast<size_t>(new_size));
        }
    }